

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

void __thiscall duckdb::CardinalityEstimator::RemoveEmptyTotalDomains(CardinalityEstimator *this)

{
  pointer pRVar1;
  pointer poVar2;
  idx_t iVar3;
  pointer poVar4;
  pointer pbVar5;
  pointer pRVar6;
  pointer pRVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  iterator iVar11;
  pointer pRVar12;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  pRVar6 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pRVar1 - (long)pRVar6;
  pRVar7 = pRVar6;
  uVar10 = uVar8;
  iVar11._M_current = pRVar1;
  if (0 < (long)uVar8 >> 9) {
    pRVar7 = (pointer)((long)&(pRVar6->equivalent_relations)._M_h._M_buckets +
                      (uVar8 & 0xfffffffffffffe00));
    lVar9 = ((long)uVar8 >> 9) + 1;
    pRVar12 = pRVar6 + 2;
    do {
      if (pRVar12[-2].equivalent_relations._M_h._M_element_count == 0) {
        pRVar12 = pRVar12 + -2;
        goto LAB_00c65f0f;
      }
      if (pRVar12[-1].equivalent_relations._M_h._M_element_count == 0) {
        pRVar12 = pRVar12 + -1;
        goto LAB_00c65f0f;
      }
      if ((pRVar12->equivalent_relations)._M_h._M_element_count == 0) goto LAB_00c65f0f;
      if (pRVar12[1].equivalent_relations._M_h._M_element_count == 0) {
        pRVar12 = pRVar12 + 1;
        goto LAB_00c65f0f;
      }
      lVar9 = lVar9 + -1;
      pRVar12 = pRVar12 + 4;
    } while (1 < lVar9);
    uVar10 = (long)pRVar1 - (long)pRVar7;
  }
  lVar9 = (long)uVar10 >> 7;
  if (lVar9 == 1) {
LAB_00c65eee:
    pRVar12 = pRVar7;
    if ((pRVar7->equivalent_relations)._M_h._M_element_count != 0) {
      pRVar12 = pRVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_00c65ee3:
    pRVar12 = pRVar7;
    if ((pRVar7->equivalent_relations)._M_h._M_element_count != 0) {
      pRVar7 = pRVar7 + 1;
      goto LAB_00c65eee;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_00c65fe8;
    pRVar12 = pRVar7;
    if ((pRVar7->equivalent_relations)._M_h._M_element_count != 0) {
      pRVar7 = pRVar7 + 1;
      goto LAB_00c65ee3;
    }
  }
LAB_00c65f0f:
  if ((pRVar12 != pRVar1) && (pRVar7 = pRVar12 + 1, iVar11._M_current = pRVar12, pRVar7 != pRVar1))
  {
    do {
      if ((pRVar7->equivalent_relations)._M_h._M_element_count != 0) {
        ::std::
        _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_M_move_assign((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)iVar11._M_current,pRVar7);
        (iVar11._M_current)->has_tdom_hll = pRVar7->has_tdom_hll;
        iVar3 = pRVar7->tdom_no_hll;
        (iVar11._M_current)->tdom_hll = pRVar7->tdom_hll;
        (iVar11._M_current)->tdom_no_hll = iVar3;
        poVar2 = ((iVar11._M_current)->filters).
                 super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 .
                 super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar4 = (pRVar7->filters).
                 super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 .
                 super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ((iVar11._M_current)->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pRVar7->filters).
             super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
             .
             super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ((iVar11._M_current)->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar4;
        ((iVar11._M_current)->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pRVar7->filters).
             super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
             .
             super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar7->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar7->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar7->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (poVar2 != (pointer)0x0) {
          operator_delete(poVar2);
        }
        local_38 = ((iVar11._M_current)->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar5 = (pRVar7->column_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_48 = ((iVar11._M_current)->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbStack_40 = ((iVar11._M_current)->column_names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        ((iVar11._M_current)->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pRVar7->column_names).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ((iVar11._M_current)->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        ((iVar11._M_current)->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pRVar7->column_names).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar7->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar7->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar7->column_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        iVar11._M_current = iVar11._M_current + 1;
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar1);
    pRVar6 = (this->relations_to_tdoms).
             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(this->relations_to_tdoms).
                  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6;
  }
LAB_00c65fe8:
  ::std::vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>::_M_erase
            ((vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_> *)this,
             iVar11,(RelationsToTDom *)
                    ((long)&(pRVar6->equivalent_relations)._M_h._M_buckets + uVar8));
  return;
}

Assistant:

void CardinalityEstimator::RemoveEmptyTotalDomains() {
	auto remove_start = std::remove_if(relations_to_tdoms.begin(), relations_to_tdoms.end(),
	                                   [](RelationsToTDom &r_2_tdom) { return r_2_tdom.equivalent_relations.empty(); });
	relations_to_tdoms.erase(remove_start, relations_to_tdoms.end());
}